

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O1

QLayoutItem * __thiscall
QMainWindowLayoutState::itemAt(QMainWindowLayoutState *this,int index,int *x)

{
  QLayoutItem *pQVar1;
  
  pQVar1 = QToolBarAreaLayout::itemAt(&this->toolBarAreaLayout,x,index);
  if (pQVar1 != (QLayoutItem *)0x0) {
    return pQVar1;
  }
  pQVar1 = QDockAreaLayout::itemAt(&this->dockAreaLayout,x,index);
  return pQVar1;
}

Assistant:

QLayoutItem *QMainWindowLayoutState::itemAt(int index, int *x) const
{
#if QT_CONFIG(toolbar)
    if (QLayoutItem *ret = toolBarAreaLayout.itemAt(x, index))
        return ret;
#endif

#if QT_CONFIG(dockwidget)
    if (QLayoutItem *ret = dockAreaLayout.itemAt(x, index))
        return ret;
#else
    if (centralWidgetItem  && (*x)++ == index)
        return centralWidgetItem;
#endif

    return nullptr;
}